

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::javanano::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,FieldDescriptor *field)

{
  ulong *puVar1;
  float value;
  double value_00;
  long lVar2;
  Type TVar3;
  LogMessage *other;
  Params *params_00;
  long *plVar4;
  EnumValueDescriptor *pEVar5;
  undefined8 *puVar6;
  uint *descriptor;
  size_type *psVar7;
  ulong *puVar8;
  char *pcVar9;
  FieldDescriptor *field_00;
  ulong uVar10;
  char *pcVar11;
  javanano *this_00;
  undefined8 uVar12;
  undefined1 local_98 [56];
  string local_60;
  string local_40;
  
  if (*(int *)&(params->java_packages_)._M_t._M_impl.field_0x4 == 3) {
    EmptyArrayName_abi_cxx11_(__return_storage_ptr__,this,params,field);
    return __return_storage_ptr__;
  }
  if (this[0xdb] == (javanano)0x1) {
    if ((this[0xdf] == (javanano)0x1) &&
       (TVar3 = FieldDescriptor::type((FieldDescriptor *)params),
       *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) == 8)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Integer.MIN_VALUE";
      pcVar9 = "";
      goto LAB_0021d7df;
    }
switchD_0021d7b4_caseD_a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar11 = "null";
    pcVar9 = "";
    goto LAB_0021d7df;
  }
  this_00 = this;
  TVar3 = FieldDescriptor::type((FieldDescriptor *)params);
  descriptor = &switchD_0021d7b4::switchdataD_00357eac;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4)) {
  case 1:
  case 3:
    SimpleItoa_abi_cxx11_
              (__return_storage_ptr__,
               (protobuf *)
               (ulong)(uint)(params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,(int)field_00);
    return __return_storage_ptr__;
  case 2:
    SimpleItoa_abi_cxx11_
              ((string *)local_98,
               (protobuf *)
               (params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (long)field_00);
    plVar4 = (long *)std::__cxx11::string::append(local_98);
    goto LAB_0021d856;
  case 4:
    SimpleItoa_abi_cxx11_
              ((string *)local_98,
               (protobuf *)
               (params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (long)field_00);
    plVar4 = (long *)std::__cxx11::string::append(local_98);
LAB_0021d856:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar7) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    break;
  case 5:
    value_00 = (double)(params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count;
    if (INFINITY <= value_00) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Double.POSITIVE_INFINITY";
      pcVar9 = "";
      goto LAB_0021d7df;
    }
    if (value_00 <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Double.NEGATIVE_INFINITY";
      pcVar9 = "";
      goto LAB_0021d7df;
    }
    if (NAN(value_00)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Double.NaN";
      pcVar9 = "";
      goto LAB_0021d7df;
    }
    SimpleDtoa_abi_cxx11_((string *)local_98,(protobuf *)this_00,value_00);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,"D"
                  );
    break;
  case 6:
    value = *(float *)&(params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count;
    if (INFINITY <= value) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Float.POSITIVE_INFINITY";
      pcVar9 = "";
      goto LAB_0021d7df;
    }
    if (value <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Float.NEGATIVE_INFINITY";
      pcVar9 = "";
      goto LAB_0021d7df;
    }
    if (NAN(value)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Float.NaN";
      pcVar9 = "";
      goto LAB_0021d7df;
    }
    SimpleFtoa_abi_cxx11_((string *)local_98,(protobuf *)this_00,value);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,"F"
                  );
    break;
  case 7:
    uVar10 = (ulong)(byte)(params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count;
    pcVar11 = "false";
    if (uVar10 != 0) {
      pcVar11 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = pcVar11 + (uVar10 ^ 5);
    goto LAB_0021d7df;
  case 8:
    params_00 = (Params *)FieldDescriptor::enum_type((FieldDescriptor *)params);
    ClassName_abi_cxx11_(&local_40,this,params_00,(EnumDescriptor *)descriptor);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
    puVar1 = (ulong *)(local_98 + 0x10);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_98._16_8_ = *puVar8;
      local_98._24_8_ = plVar4[3];
      local_98._0_8_ = puVar1;
    }
    else {
      local_98._16_8_ = *puVar8;
      local_98._0_8_ = (ulong *)*plVar4;
    }
    local_98._8_8_ = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    pEVar5 = FieldDescriptor::default_value_enum((FieldDescriptor *)params);
    RenameKeywords::RenameJavaKeywordsImpl
              (&local_60,(RenameKeywords *)sRenameKeywords,*(string **)pEVar5);
    pcVar11 = (char *)0xf;
    if ((ulong *)local_98._0_8_ != puVar1) {
      pcVar11 = (char *)local_98._16_8_;
    }
    if (pcVar11 < (char *)(local_98._8_8_ + local_60._M_string_length)) {
      uVar12 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        uVar12 = local_60.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < (char *)(local_98._8_8_ + local_60._M_string_length)) goto LAB_0021daf8;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,local_98._0_8_);
    }
    else {
LAB_0021daf8:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append(local_98,(ulong)local_60._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = puVar6 + 2;
    if ((size_type *)*puVar6 == psVar7) {
      uVar12 = puVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar12;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = puVar6[1];
    *puVar6 = psVar7;
    puVar6[1] = 0;
    *(undefined1 *)psVar7 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,(ulong)(local_60.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((ulong *)local_98._0_8_ != puVar1) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0021db9e;
  case 9:
    if (*(long *)((params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header._M_node_count
                 + 8) != 0) {
      FieldDefaultConstantName_abi_cxx11_(__return_storage_ptr__,(javanano *)params,field_00);
      return __return_storage_ptr__;
    }
    TVar3 = FieldDescriptor::type((FieldDescriptor *)params);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (TVar3 == TYPE_BYTES) {
      pcVar11 = "com.google.protobuf.nano.WireFormatNano.EMPTY_BYTES";
      pcVar9 = "";
    }
    else {
      pcVar11 = "\"\"";
      pcVar9 = "";
    }
    goto LAB_0021d7df;
  case 10:
    goto switchD_0021d7b4_caseD_a;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_helpers.cc"
               ,0x1de);
    other = internal::LogMessage::operator<<((LogMessage *)local_98,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_98);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "";
    pcVar11 = pcVar9;
LAB_0021d7df:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar11,pcVar9)
    ;
    return __return_storage_ptr__;
  }
  local_40.field_2._M_allocated_capacity = local_98._16_8_;
  local_40._M_dataplus._M_p = (pointer)local_98._0_8_;
  if ((undefined1 *)local_98._0_8_ == local_98 + 0x10) {
    return __return_storage_ptr__;
  }
LAB_0021db9e:
  operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const Params& params, const FieldDescriptor* field) {
  if (field->label() == FieldDescriptor::LABEL_REPEATED) {
    return EmptyArrayName(params, field);
  }

  if (params.use_reference_types_for_primitives()) {
    if (params.reftypes_primitive_enums()
          && field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      return "Integer.MIN_VALUE";
    }
    return "null";
  }

  // Switch on cpp_type since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return SimpleItoa(static_cast<int32>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return SimpleItoa(field->default_value_int64()) + "L";
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(static_cast<int64>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return SimpleDtoa(value) + "D";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return SimpleFtoa(value) + "F";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (!field->default_value_string().empty()) {
        // Point it to the static final in the generated code.
        return FieldDefaultConstantName(field);
      } else {
        if (field->type() == FieldDescriptor::TYPE_BYTES) {
          return "com.google.protobuf.nano.WireFormatNano.EMPTY_BYTES";
        } else {
          return "\"\"";
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return ClassName(params, field->enum_type()) + "." +
             RenameJavaKeywords(field->default_value_enum()->name());

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "null";

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}